

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted-usec-list.c
# Opt level: O3

int sul_compare(lws_dll2_t *d,lws_dll2_t *i)

{
  int iVar1;
  
  iVar1 = 1;
  if ((long)d[1].prev <= (long)i[1].prev) {
    iVar1 = -(uint)((long)d[1].prev < (long)i[1].prev);
  }
  return iVar1;
}

Assistant:

static int
sul_compare(const lws_dll2_t *d, const lws_dll2_t *i)
{
	lws_usec_t a = ((lws_sorted_usec_list_t *)d)->us;
	lws_usec_t b = ((lws_sorted_usec_list_t *)i)->us;

	/*
	 * Simply returning (a - b) in an int
	 * may lead to an integer overflow bug
	 */

	if (a > b)
		return 1;
	if (a < b)
		return -1;

	return 0;
}